

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

char * Qiniu_Mac_SignToken(Qiniu_Mac *self,char *policy_str)

{
  char *data_00;
  char *s1;
  char *pcVar1;
  char *token;
  char *sign;
  char *data;
  char *policy_str_local;
  Qiniu_Mac *self_local;
  
  data_00 = Qiniu_String_Encode(policy_str);
  s1 = Qiniu_Mac_Sign(self,data_00);
  pcVar1 = Qiniu_String_Concat3(s1,":",data_00);
  Qiniu_Free(s1);
  Qiniu_Free(data_00);
  return pcVar1;
}

Assistant:

char *Qiniu_Mac_SignToken(Qiniu_Mac *self, char *policy_str)
{
	char *data;
	char *sign;
	char *token;

	data = Qiniu_String_Encode(policy_str);
	sign = Qiniu_Mac_Sign(self, data);
	token = Qiniu_String_Concat3(sign, ":", data);

	Qiniu_Free(sign);
	Qiniu_Free(data);

	return token;
}